

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall
ParserTestDuplicateEdgeWithMultipleOutputs::Run(ParserTestDuplicateEdgeWithMultipleOutputs *this)

{
  int iVar1;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild out1 out2: cat in1\nbuild out1: cat in2\nbuild final: cat out1\n"
            );
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateEdgeWithMultipleOutputs) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out1 out2: cat in1\n"
"build out1: cat in2\n"
"build final: cat out1\n"
));
  // AssertParse() checks that the generated build graph is self-consistent.
  // That's all the checking that this test needs.
}